

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O2

void __thiscall
amrex::STLtools::getIntercept
          (STLtools *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_EB2::Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom,
          RunOn param_5,Box *param_6)

{
  Real *pRVar1;
  Real *pRVar2;
  long lVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  pointer pTVar24;
  pointer pXVar25;
  uint *puVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  XDim3 *pXVar44;
  uint uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  pointer pXVar54;
  ulong uVar55;
  ulong uVar56;
  Real *pRVar57;
  long lVar58;
  bool bVar59;
  uint uVar60;
  int iVar61;
  ulong uVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  Real *pRVar67;
  long lVar68;
  ulong uVar69;
  ulong uVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  double dVar73;
  undefined1 auVar74 [16];
  double dVar75;
  double dVar76;
  double dVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  double dVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  Box bx;
  double dStack_270;
  double dStack_230;
  double dStack_220;
  double dStack_1a0;
  Box local_74;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  uVar18 = this->m_num_tri;
  dVar5 = (geom->prob_domain).xlo[0];
  dVar6 = (geom->prob_domain).xlo[1];
  dVar7 = (geom->prob_domain).xlo[2];
  dVar8 = (geom->super_CoordSys).dx[0];
  dVar9 = (geom->super_CoordSys).dx[1];
  dVar10 = (geom->super_CoordSys).dx[2];
  pTVar24 = (this->m_tri_pts_d).m_data;
  pXVar25 = (this->m_tri_normals_d).m_data;
  lVar58 = 0;
  uVar69 = 0;
  if (0 < (int)uVar18) {
    uVar69 = (ulong)uVar18;
  }
  pRVar1 = &pXVar25->z;
  pRVar2 = &(pTVar24->v3).z;
  do {
    if (lVar58 == 3) {
      return;
    }
    Box::Box<double>(&local_74,inter_arr->_M_elems + lVar58);
    puVar26 = type_arr->_M_elems[lVar58].p;
    lVar27 = type_arr->_M_elems[lVar58].jstride;
    lVar28 = type_arr->_M_elems[lVar58].kstride;
    uVar62 = (ulong)type_arr->_M_elems[lVar58].begin.x;
    iVar19 = type_arr->_M_elems[lVar58].begin.y;
    iVar20 = type_arr->_M_elems[lVar58].begin.z;
    pdVar29 = lst->p;
    lVar30 = lst->jstride;
    lVar31 = lst->kstride;
    pdVar32 = inter_arr->_M_elems[lVar58].p;
    lVar33 = inter_arr->_M_elems[lVar58].jstride;
    lVar34 = inter_arr->_M_elems[lVar58].kstride;
    iVar21 = inter_arr->_M_elems[lVar58].begin.x;
    iVar22 = inter_arr->_M_elems[lVar58].begin.y;
    iVar23 = inter_arr->_M_elems[lVar58].begin.z;
    lVar50 = (long)(lst->begin).x;
    lVar51 = (long)(lst->begin).y;
    lVar46 = (long)(lst->begin).z;
    lVar64 = (long)local_74.smallend.vect[2];
    while (lVar64 <= local_74.bigend.vect[2]) {
      lVar47 = lVar64 - iVar20;
      lVar3 = lVar64 + 1;
      lVar48 = lVar64 - iVar23;
      dVar83 = (double)(int)lVar64 * dVar10 + dVar7;
      lVar65 = (lVar64 - lVar46) * lVar31;
      dVar75 = (double)(int)lVar3 * dVar10 + dVar7;
      local_58._8_8_ = dVar83;
      local_58._0_8_ = dVar83;
      lVar66 = (long)local_74.smallend.vect[1];
      while (lVar64 = lVar3, lVar66 <= local_74.bigend.vect[1]) {
        if (local_74.bigend.vect[0] < local_74.smallend.vect[0]) {
          lVar66 = lVar66 + 1;
        }
        else {
          lVar52 = lVar66 - iVar19;
          lVar64 = lVar66 + 1;
          lVar53 = lVar66 - iVar22;
          local_48 = (double)(int)lVar66 * dVar9 + dVar6;
          dVar76 = (double)(int)lVar64 * dVar9 + dVar6;
          lVar49 = (lVar66 - lVar51) * lVar30;
          lVar68 = (long)local_74.smallend.vect[0];
          do {
            dVar90 = NAN;
            if (puVar26[lVar47 * lVar28 + lVar52 * lVar27 + (lVar68 - uVar62)] == 2) {
              dVar43 = (double)(int)lVar68 * dVar8 + dVar5;
              uVar85 = (undefined4)((ulong)dVar43 >> 0x20);
              if ((int)lVar58 == 1) {
                lVar66 = lVar68 - lVar50;
                auVar42._8_4_ = SUB84(dVar43,0);
                auVar42._0_8_ = dVar43;
                auVar42._12_4_ = uVar85;
                pRVar57 = pRVar2;
                uVar70 = uVar62;
                pRVar67 = pRVar1;
                for (uVar55 = 0; dVar90 = NAN, uVar56 = uVar69, uVar69 != uVar55;
                    uVar55 = uVar55 + 1) {
                  dVar91 = pRVar57[-8];
                  dVar11 = pRVar57[-7];
                  dVar12 = pRVar57[-6];
                  dVar13 = pRVar57[-4];
                  dVar73 = pRVar57[-3];
                  dVar14 = pRVar57[-5];
                  dVar16 = pRVar57[-1];
                  dVar15 = *pRVar57;
                  dVar17 = ((XDim3 *)(pRVar57 + -2))->x;
                  dVar93 = pRVar67[-1];
                  dVar90 = 0.0;
                  if (((0.0 < pdVar29[lVar65 + (lVar64 - lVar51) * lVar30 + lVar66] -
                              pdVar29[lVar65 + lVar49 + lVar66]) && (0.0 < dVar93)) ||
                     ((pdVar29[lVar65 + (lVar64 - lVar51) * lVar30 + lVar66] -
                       pdVar29[lVar65 + lVar49 + lVar66] < 0.0 && (dVar93 < 0.0)))) {
LAB_005ea291:
                    bVar59 = false;
                  }
                  else {
                    dVar92 = dVar13;
                    if (dVar13 <= dVar11) {
                      dVar92 = dVar11;
                    }
                    dVar94 = dVar16;
                    if (dVar16 <= dVar92) {
                      dVar94 = dVar92;
                    }
                    if (local_48 <= dVar94) {
                      dVar92 = dVar13;
                      if (dVar11 <= dVar13) {
                        dVar92 = dVar11;
                      }
                      dVar94 = dVar16;
                      if (dVar92 <= dVar16) {
                        dVar94 = dVar92;
                      }
                      if (dVar94 <= dVar76) {
                        dVar92 = dVar73;
                        if (dVar73 <= dVar12) {
                          dVar92 = dVar12;
                        }
                        dVar94 = dVar15;
                        if (dVar15 <= dVar92) {
                          dVar94 = dVar92;
                        }
                        if (dVar83 <= dVar94) {
                          dVar92 = dVar73;
                          if (dVar12 <= dVar73) {
                            dVar92 = dVar12;
                          }
                          dVar94 = dVar15;
                          if (dVar92 <= dVar15) {
                            dVar94 = dVar92;
                          }
                          if (dVar94 <= dVar83) {
                            dVar92 = dVar14;
                            if (dVar14 <= dVar91) {
                              dVar92 = dVar91;
                            }
                            dVar94 = dVar17;
                            if (dVar17 <= dVar92) {
                              dVar94 = dVar92;
                            }
                            if (dVar43 <= dVar94) {
                              dVar92 = dVar14;
                              if (dVar91 <= dVar14) {
                                dVar92 = dVar91;
                              }
                              dVar94 = dVar17;
                              if (dVar92 <= dVar17) {
                                dVar94 = dVar92;
                              }
                              bVar59 = false;
                              if ((dVar43 < dVar94) || ((dVar93 == 0.0 && (!NAN(dVar93)))))
                              goto LAB_005ea293;
                              dStack_270 = auVar42._8_8_;
                              dVar92 = (dVar43 - dVar14) * (dVar73 - dVar12) -
                                       (dVar14 - dVar91) * (dVar83 - dVar73);
                              dVar94 = (dStack_270 - dVar91) * (dVar12 - dVar15) -
                                       (dVar91 - dVar17) * (dVar83 - dVar12);
                              auVar71._8_8_ = -(ulong)(ABS(dVar94) < 2.220446049250313e-16);
                              auVar71._0_8_ = -(ulong)(ABS(dVar92) < 2.220446049250313e-16);
                              uVar45 = movmskpd((int)uVar70,auVar71);
                              uVar70 = (ulong)uVar45;
                              if (((uVar45 & 2) == 0) &&
                                 (((uVar45 & 1) == 0 &&
                                  (dVar95 = (dVar43 - dVar17) * (dVar15 - dVar73) -
                                            (dVar17 - dVar14) * (dVar83 - dVar15),
                                  2.220446049250313e-16 <= ABS(dVar95))))) {
                                auVar72._0_8_ = (ulong)dVar92 & 0x8000000000000000;
                                auVar72._8_8_ = (ulong)dVar94 & 0x8000000000000000;
                                auVar79._0_8_ = (ulong)dVar95 & 0x8000000000000000;
                                auVar79._8_8_ = (ulong)dVar95 & 0x8000000000000000;
                                auVar80._8_8_ =
                                     -(ulong)(SUB168(auVar79 | _DAT_00601290,8) ==
                                             SUB168(auVar72 | _DAT_00601290,8));
                                auVar80._0_8_ =
                                     -(ulong)(SUB168(auVar79 | _DAT_00601290,0) ==
                                             SUB168(auVar72 | _DAT_00601290,0));
                                uVar45 = movmskpd(uVar45,auVar80);
                                uVar70 = (ulong)uVar45;
                                if (uVar45 != 3) goto LAB_005ea291;
                              }
                              dVar93 = (((dVar91 + dVar14 + dVar17) * 0.3333333333333333 *
                                         ((XDim3 *)(pRVar67 + -2))->x +
                                        (dVar11 + dVar13 + dVar16) * 0.3333333333333333 * dVar93 +
                                        (dVar12 + dVar73 + dVar15) * 0.3333333333333333 * *pRVar67)
                                       - (*pRVar67 * dVar83 + ((XDim3 *)(pRVar67 + -2))->x * dVar43)
                                       ) / dVar93;
                              bVar59 = true;
                              dVar90 = local_48;
                              if (((2.220446049250313e-16 <= ABS(local_48 - dVar93)) &&
                                  (bVar59 = true, dVar90 = dVar76,
                                  2.220446049250313e-16 <= ABS(dVar76 - dVar93))) &&
                                 (bVar59 = local_48 < dVar93 && dVar93 < dVar76, dVar90 = dVar93,
                                 local_48 >= dVar93 || dVar93 >= dVar76)) {
                                dVar90 = 0.0;
                              }
                              goto LAB_005ea293;
                            }
                          }
                        }
                      }
                      goto LAB_005ea291;
                    }
                    bVar59 = false;
                  }
LAB_005ea293:
                  uVar56 = uVar55;
                  if (bVar59) break;
                  pRVar67 = pRVar67 + 3;
                  pRVar57 = pRVar57 + 9;
                }
                if ((uint)uVar56 == uVar18) {
                  uVar70 = -(ulong)(0.0 < pdVar29[lVar65 + lVar49 + lVar66]) & (ulong)local_48;
                  uVar55 = ~-(ulong)(0.0 < pdVar29[lVar65 + lVar49 + lVar66]) & (ulong)dVar76;
LAB_005eaa91:
                  dVar90 = (double)(uVar55 | uVar70);
                }
              }
              else if ((int)lVar58 == 0) {
                dVar91 = (double)(int)(lVar68 + 1) * dVar8 + dVar5;
                uVar45 = 0;
                pXVar54 = pXVar25;
                for (lVar66 = 0; dVar90 = NAN, uVar60 = (uint)uVar69, uVar69 * 0x48 != lVar66;
                    lVar66 = lVar66 + 0x48) {
                  if (((0.0 < pdVar29[lVar49 + lVar65 + ((lVar68 + 1) - lVar50)] -
                              pdVar29[lVar49 + lVar65 + (lVar68 - lVar50)]) && (0.0 < pXVar54->x))
                     || ((pdVar29[lVar49 + lVar65 + ((lVar68 + 1) - lVar50)] -
                          pdVar29[lVar49 + lVar65 + (lVar68 - lVar50)] < 0.0 &&
                         (pXVar54->x <= 0.0 && pXVar54->x != 0.0)))) {
LAB_005e9e47:
                    bVar59 = false;
                    dVar90 = 0.0;
                  }
                  else {
                    pdVar4 = (double *)((long)&(pTVar24->v1).x + lVar66);
                    dVar11 = *pdVar4;
                    dVar12 = pdVar4[3];
                    dVar90 = dVar12;
                    if (dVar12 <= dVar11) {
                      dVar90 = dVar11;
                    }
                    dVar13 = pdVar4[6];
                    dVar73 = dVar13;
                    if (dVar13 <= dVar90) {
                      dVar73 = dVar90;
                    }
                    dVar90 = 0.0;
                    if (dVar73 < dVar43) goto LAB_005e9e47;
                    pdVar63 = (double *)((long)&(pTVar24->v2).x + lVar66);
                    dVar73 = dVar12;
                    if (dVar11 <= dVar12) {
                      dVar73 = dVar11;
                      pdVar63 = pdVar4;
                    }
                    if (dVar13 < dVar73) {
                      pdVar63 = (double *)((long)&(pTVar24->v3).x + lVar66);
                    }
                    if (*pdVar63 <= dVar91) {
                      dVar73 = *(double *)((long)&(pTVar24->v1).y + lVar66);
                      dVar14 = *(double *)((long)&(pTVar24->v2).y + lVar66);
                      dVar16 = dVar14;
                      if (dVar14 <= dVar73) {
                        dVar16 = dVar73;
                      }
                      dVar15 = *(double *)((long)&(pTVar24->v3).y + lVar66);
                      dVar17 = dVar15;
                      if (dVar15 <= dVar16) {
                        dVar17 = dVar16;
                      }
                      if (local_48 <= dVar17) {
                        dVar16 = dVar14;
                        pXVar44 = &pTVar24->v2;
                        if (dVar73 <= dVar14) {
                          dVar16 = dVar73;
                          pXVar44 = &pTVar24->v1;
                        }
                        if (dVar15 < dVar16) {
                          pXVar44 = &pTVar24->v3;
                        }
                        if (*(double *)((long)&pXVar44->y + lVar66) <= local_48) {
                          dVar16 = *(double *)((long)&(pTVar24->v1).z + lVar66);
                          dVar17 = *(double *)((long)&(pTVar24->v2).z + lVar66);
                          dVar93 = dVar17;
                          if (dVar17 <= dVar16) {
                            dVar93 = dVar16;
                          }
                          dVar92 = *(double *)((long)&(pTVar24->v3).z + lVar66);
                          dVar94 = dVar92;
                          if (dVar92 <= dVar93) {
                            dVar94 = dVar93;
                          }
                          if (dVar83 <= dVar94) {
                            dVar93 = dVar17;
                            pXVar44 = &pTVar24->v2;
                            if (dVar16 <= dVar17) {
                              dVar93 = dVar16;
                              pXVar44 = &pTVar24->v1;
                            }
                            pdVar4 = (double *)((long)&(pTVar24->v3).z + lVar66);
                            pdVar63 = (double *)((long)&pXVar44->z + lVar66);
                            if (dVar92 < dVar93) {
                              pdVar63 = pdVar4;
                            }
                            if (*pdVar63 <= dVar83) {
                              dVar93 = pXVar54->x;
                              if ((dVar93 == 0.0) && (!NAN(dVar93))) goto LAB_005e9e47;
                              dVar94 = (dVar83 - dVar17) * (dVar14 - dVar73) -
                                       (dVar17 - dVar16) * (local_48 - dVar14);
                              dVar95 = (dVar83 - dVar16) * (dVar73 - dVar15) -
                                       (dVar16 - dVar92) * (local_48 - dVar73);
                              auVar74._8_8_ = -(ulong)(ABS(dVar95) < 2.220446049250313e-16);
                              auVar74._0_8_ = -(ulong)(ABS(dVar94) < 2.220446049250313e-16);
                              uVar60 = movmskpd((int)pdVar4,auVar74);
                              if (((((uVar60 & 2) != 0) || ((uVar60 & 1) != 0)) ||
                                  (dVar77 = (dVar83 - dVar92) * (dVar15 - dVar14) -
                                            (dVar92 - dVar17) * (local_48 - dVar15),
                                  ABS(dVar77) < 2.220446049250313e-16)) ||
                                 (auVar78._8_8_ =
                                       -(ulong)((double)((ulong)dVar77 & 0x8000000000000000 |
                                                        0x3ff0000000000000) ==
                                               (double)((ulong)dVar95 & 0x8000000000000000 |
                                                       0x3ff0000000000000)),
                                 auVar78._0_8_ =
                                      -(ulong)((double)((ulong)dVar77 & 0x8000000000000000 |
                                                       0x3ff0000000000000) ==
                                              (double)((ulong)dVar94 & 0x8000000000000000 |
                                                      0x3ff0000000000000)),
                                 iVar61 = movmskpd(uVar60,auVar78), iVar61 == 3)) {
                                dVar93 = (((dVar16 + dVar17 + dVar92) * 0.3333333333333333 *
                                           pXVar54->z +
                                          (dVar11 + dVar12 + dVar13) * 0.3333333333333333 * dVar93 +
                                          (dVar73 + dVar14 + dVar15) * 0.3333333333333333 *
                                          pXVar54->y) -
                                         (pXVar54->y * local_48 + pXVar54->z * dVar83)) / dVar93;
                                bVar59 = true;
                                dVar90 = dVar43;
                                if (((2.220446049250313e-16 <= ABS(dVar43 - dVar93)) &&
                                    (bVar59 = true, dVar90 = dVar91,
                                    2.220446049250313e-16 <= ABS(dVar91 - dVar93))) &&
                                   (bVar59 = dVar43 < dVar93 && dVar93 < dVar91, dVar90 = dVar93,
                                   dVar43 >= dVar93 || dVar93 >= dVar91)) {
                                  dVar90 = 0.0;
                                }
                                goto LAB_005e9e49;
                              }
                              goto LAB_005e9f0a;
                            }
                          }
                          bVar59 = false;
                          goto LAB_005e9e49;
                        }
                      }
LAB_005e9f0a:
                      bVar59 = false;
                    }
                    else {
                      bVar59 = false;
                    }
                  }
LAB_005e9e49:
                  uVar60 = uVar45;
                  if (bVar59) break;
                  uVar45 = uVar45 + 1;
                  pXVar54 = pXVar54 + 1;
                }
                if (uVar60 == uVar18) {
                  dVar90 = (double)(~-(ulong)(0.0 < pdVar29[lVar49 + lVar65 + (lVar68 - lVar50)]) &
                                    (ulong)dVar91 |
                                   (ulong)dVar43 &
                                   -(ulong)(0.0 < pdVar29[lVar49 + lVar65 + (lVar68 - lVar50)]));
                }
              }
              else {
                lVar66 = lVar68 - lVar50;
                auVar35._8_4_ = SUB84(dVar43,0);
                auVar35._0_8_ = dVar43;
                auVar35._12_4_ = uVar85;
                pRVar57 = pRVar2;
                uVar70 = uVar62;
                pRVar67 = pRVar1;
                for (uVar55 = 0; dVar90 = NAN, uVar56 = uVar69, uVar69 != uVar55;
                    uVar55 = uVar55 + 1) {
                  dVar91 = pRVar57[-6];
                  dVar11 = pRVar57[-8];
                  dVar12 = pRVar57[-7];
                  dVar13 = pRVar57[-3];
                  dVar73 = pRVar57[-5];
                  dVar14 = pRVar57[-4];
                  dVar16 = *pRVar57;
                  dVar15 = ((XDim3 *)(pRVar57 + -2))->x;
                  dVar17 = pRVar57[-1];
                  dVar93 = *pRVar67;
                  dVar90 = 0.0;
                  if (((0.0 < pdVar29[lVar49 + lVar66 + (lVar3 - lVar46) * lVar31] -
                              pdVar29[lVar49 + lVar66 + lVar65]) && (0.0 < dVar93)) ||
                     ((pdVar29[lVar49 + lVar66 + (lVar3 - lVar46) * lVar31] -
                       pdVar29[lVar49 + lVar66 + lVar65] < 0.0 && (dVar93 < 0.0)))) {
LAB_005ea6fd:
                    bVar59 = false;
                  }
                  else {
                    dVar92 = dVar13;
                    if (dVar13 <= dVar91) {
                      dVar92 = dVar91;
                    }
                    uVar84 = SUB84(dVar16,0);
                    uVar87 = (undefined4)((ulong)dVar16 >> 0x20);
                    uVar85 = uVar84;
                    uVar88 = uVar87;
                    if (dVar16 <= dVar92) {
                      uVar85 = SUB84(dVar92,0);
                      uVar88 = (undefined4)((ulong)dVar92 >> 0x20);
                    }
                    if ((double)CONCAT44(uVar88,uVar85) <= dVar83 &&
                        dVar83 != (double)CONCAT44(uVar88,uVar85)) goto LAB_005ea6fd;
                    dVar92 = dVar13;
                    if (dVar91 <= dVar13) {
                      dVar92 = dVar91;
                    }
                    if (dVar92 <= dVar16) {
                      uVar84 = SUB84(dVar92,0);
                      uVar87 = (undefined4)((ulong)dVar92 >> 0x20);
                    }
                    if (dVar75 <= (double)CONCAT44(uVar87,uVar84) &&
                        (double)CONCAT44(uVar87,uVar84) != dVar75) goto LAB_005ea6fd;
                    dVar92 = dVar73;
                    if (dVar73 <= dVar11) {
                      dVar92 = dVar11;
                    }
                    uVar84 = SUB84(dVar15,0);
                    uVar87 = (undefined4)((ulong)dVar15 >> 0x20);
                    uVar85 = uVar84;
                    uVar88 = uVar87;
                    if (dVar15 <= dVar92) {
                      uVar85 = SUB84(dVar92,0);
                      uVar88 = (undefined4)((ulong)dVar92 >> 0x20);
                    }
                    if ((double)CONCAT44(uVar88,uVar85) <= dVar43 &&
                        dVar43 != (double)CONCAT44(uVar88,uVar85)) goto LAB_005ea6fd;
                    dVar92 = dVar73;
                    if (dVar11 <= dVar73) {
                      dVar92 = dVar11;
                    }
                    uVar85 = uVar84;
                    uVar88 = uVar87;
                    if (dVar92 <= dVar15) {
                      uVar85 = SUB84(dVar92,0);
                      uVar88 = (undefined4)((ulong)dVar92 >> 0x20);
                    }
                    if (dVar43 <= (double)CONCAT44(uVar88,uVar85) &&
                        (double)CONCAT44(uVar88,uVar85) != dVar43) goto LAB_005ea6fd;
                    dVar92 = dVar14;
                    if (dVar14 <= dVar12) {
                      dVar92 = dVar12;
                    }
                    uVar86 = SUB84(dVar17,0);
                    uVar89 = (undefined4)((ulong)dVar17 >> 0x20);
                    uVar85 = uVar86;
                    uVar88 = uVar89;
                    if (dVar17 <= dVar92) {
                      uVar85 = SUB84(dVar92,0);
                      uVar88 = (undefined4)((ulong)dVar92 >> 0x20);
                    }
                    if (local_48 < (double)CONCAT44(uVar88,uVar85) ||
                        local_48 == (double)CONCAT44(uVar88,uVar85)) {
                      dVar92 = dVar14;
                      if (dVar12 <= dVar14) {
                        dVar92 = dVar12;
                      }
                      if (dVar92 <= dVar17) {
                        uVar86 = SUB84(dVar92,0);
                        uVar89 = (undefined4)((ulong)dVar92 >> 0x20);
                      }
                      bVar59 = false;
                      if (local_48 <= (double)CONCAT44(uVar89,uVar86) &&
                          (double)CONCAT44(uVar89,uVar86) != local_48) goto LAB_005ea739;
                      if ((dVar93 != 0.0) || (NAN(dVar93))) {
                        auVar36._8_4_ = uVar84;
                        auVar36._0_8_ = dVar11;
                        auVar36._12_4_ = uVar87;
                        dStack_220 = auVar35._8_8_;
                        auVar37._8_4_ = SUB84(dStack_220 - dVar11,0);
                        auVar37._0_8_ = dVar43 - dVar73;
                        auVar37._12_4_ = (int)((ulong)(dStack_220 - dVar11) >> 0x20);
                        dStack_270 = auVar36._8_8_;
                        dVar94 = dVar11 - dStack_270;
                        auVar38._8_4_ = SUB84(dVar12,0);
                        auVar38._0_8_ = dVar14;
                        auVar38._12_4_ = (int)((ulong)dVar12 >> 0x20);
                        dStack_270 = auVar38._8_8_;
                        dVar92 = (local_48 - dVar14) * (dVar73 - dVar11);
                        dVar94 = (local_48 - dStack_270) * dVar94;
                        auVar39._8_4_ = SUB84(dVar94,0);
                        auVar39._0_8_ = dVar92;
                        auVar39._12_4_ = (int)((ulong)dVar94 >> 0x20);
                        auVar40._8_4_ = SUB84(dStack_270 - dVar17,0);
                        auVar40._0_8_ = dVar14 - dVar12;
                        auVar40._12_4_ = (int)((ulong)(dStack_270 - dVar17) >> 0x20);
                        dStack_270 = auVar40._8_8_;
                        dStack_230 = auVar37._8_8_;
                        dStack_1a0 = auVar39._8_8_;
                        dVar92 = dVar92 - (dVar14 - dVar12) * (dVar43 - dVar73);
                        dStack_1a0 = dStack_1a0 - dStack_270 * dStack_230;
                        auVar41._8_4_ = SUB84(dStack_1a0,0);
                        auVar41._0_8_ = dVar92;
                        auVar41._12_4_ = (int)((ulong)dStack_1a0 >> 0x20);
                        auVar81._8_8_ = -(ulong)(ABS(dStack_1a0) < 2.220446049250313e-16);
                        auVar81._0_8_ = -(ulong)(ABS(dVar92) < 2.220446049250313e-16);
                        uVar45 = movmskpd((int)uVar70,auVar81);
                        uVar70 = (ulong)uVar45;
                        if (((uVar45 & 2) == 0) &&
                           (((uVar45 & 1) == 0 &&
                            (dVar94 = (local_48 - dVar17) * (dVar15 - dVar73) -
                                      (dVar17 - dVar14) * (dVar43 - dVar15),
                            2.220446049250313e-16 <= ABS(dVar94))))) {
                          dStack_1a0 = auVar41._8_8_;
                          auVar82._8_8_ =
                               -(ulong)((double)((ulong)dVar94 & 0x8000000000000000 |
                                                0x3ff0000000000000) ==
                                       (double)((ulong)dStack_1a0 & 0x8000000000000000 |
                                               0x3ff0000000000000));
                          auVar82._0_8_ =
                               -(ulong)((double)((ulong)dVar94 & 0x8000000000000000 |
                                                0x3ff0000000000000) ==
                                       (double)((ulong)dVar92 & 0x8000000000000000 |
                                               0x3ff0000000000000));
                          uVar45 = movmskpd(uVar45,auVar82);
                          uVar70 = (ulong)uVar45;
                          if (uVar45 != 3) goto LAB_005ea6fd;
                        }
                        dVar93 = (((dVar12 + dVar14 + dVar17) * 0.3333333333333333 * pRVar67[-1] +
                                  (dVar91 + dVar13 + dVar16) * 0.3333333333333333 * dVar93 +
                                  (dVar11 + dVar73 + dVar15) * 0.3333333333333333 *
                                  ((XDim3 *)(pRVar67 + -2))->x) -
                                 (((XDim3 *)(pRVar67 + -2))->x * dVar43 + pRVar67[-1] * local_48)) /
                                 dVar93;
                        bVar59 = true;
                        dVar90 = dVar83;
                        if (((2.220446049250313e-16 <= ABS(dVar83 - dVar93)) &&
                            (bVar59 = true, dVar90 = dVar75,
                            2.220446049250313e-16 <= ABS(dVar75 - dVar93))) &&
                           (bVar59 = dVar83 < dVar93 && dVar93 < dVar75, dVar90 = dVar93,
                           dVar83 >= dVar93 || dVar93 >= dVar75)) {
                          dVar90 = 0.0;
                        }
                      }
                    }
                    else {
LAB_005ea739:
                      bVar59 = false;
                    }
                  }
                  uVar56 = uVar55;
                  if (bVar59) break;
                  pRVar67 = pRVar67 + 3;
                  pRVar57 = pRVar57 + 9;
                }
                if ((uint)uVar56 == uVar18) {
                  uVar70 = -(ulong)(0.0 < pdVar29[lVar49 + lVar66 + lVar65]) & (ulong)dVar83;
                  uVar55 = ~-(ulong)(0.0 < pdVar29[lVar49 + lVar66 + lVar65]) & (ulong)dVar75;
                  goto LAB_005eaa91;
                }
              }
            }
            pdVar32[lVar48 * lVar34 + lVar53 * lVar33 + (lVar68 - iVar21)] = dVar90;
            lVar68 = lVar68 + 1;
            lVar66 = lVar64;
            dStack_40 = local_48;
          } while (local_74.bigend.vect[0] + 1 != (int)lVar68);
        }
      }
    }
    lVar58 = lVar58 + 1;
  } while( true );
}

Assistant:

void
STLtools::getIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                        Array<Array4<EB2::Type_t const>,AMREX_SPACEDIM> const& type_arr,
                        Array4<Real const> const& lst ,Geometry const& geom,
                        RunOn, Box const&) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    const XDim3* tri_norm = m_tri_normals_d.data();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        Array4<Real> const& inter = inter_arr[idim];
        Array4<EB2::Type_t const> const& type = type_arr[idim];
        const Box bx{inter};
        ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real r = std::numeric_limits<Real>::quiet_NaN();
            if (type(i,j,k) == EB2::Type::irregular) {
                XDim3 p1{plo[0]+i*dx[0],
                         plo[1]+j*dx[1],
#if (AMREX_SPACEDIM == 2)
                         Real(0.)
#else
                         plo[2]+k*dx[2]
#endif
                };
                if (idim == 0) {
                    Real x2 = plo[0]+(i+1)*dx[0];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto tmp = edge_tri_intersects(p1.x, x2, p1.y, p1.z,
                                                       tri.v1, tri.v2, tri.v3,
                                                       tri_norm[it],
                                                       lst(i+1,j,k)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.x : x2;
                    }
                } else if (idim == 1) {
                    Real y2 = plo[1]+(j+1)*dx[1];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto const& norm = tri_norm[it];
                        auto tmp = edge_tri_intersects(p1.y, y2, p1.z, p1.x,
                                                       {tri.v1.y, tri.v1.z, tri.v1.x},
                                                       {tri.v2.y, tri.v2.z, tri.v2.x},
                                                       {tri.v3.y, tri.v3.z, tri.v3.x},
                                                       {  norm.y,   norm.z,   norm.x},
                                                       lst(i,j+1,k)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.y : y2;
                    }
                } else {
                    Real z2 = plo[2]+(k+1)*dx[2];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto const& norm = tri_norm[it];
                        auto tmp = edge_tri_intersects(p1.z, z2, p1.x, p1.y,
                                                       {tri.v1.z, tri.v1.x, tri.v1.y},
                                                       {tri.v2.z, tri.v2.x, tri.v2.y},
                                                       {tri.v3.z, tri.v3.x, tri.v3.y},
                                                       {  norm.z,   norm.x,   norm.y},
                                                       lst(i,j,k+1)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.z : z2;
                    }
                }
            }
            inter(i,j,k) = r;
        });
    }
}